

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QString * __thiscall
Mustache::PartialFileLoader::getPartial
          (QString *__return_storage_ptr__,PartialFileLoader *this,QString *name)

{
  qsizetype qVar1;
  bool bVar2;
  byte bVar3;
  QString local_e8;
  piter local_d0;
  QString local_c0;
  QTextStream local_a8 [8];
  QTextStream stream;
  QFlags<QIODeviceBase::OpenModeFlag> local_94;
  QFile local_90 [8];
  QFile file;
  QChar local_6a;
  QString local_68;
  QString local_50;
  undefined1 local_38 [8];
  QString path;
  QString *name_local;
  PartialFileLoader *this_local;
  
  path.d.size = (qsizetype)name;
  bVar2 = QHash<QString,_QString>::contains(&this->m_cache,name);
  if (!bVar2) {
    QChar::QChar(&local_6a,'/');
    operator+(&local_68,&this->m_basePath,local_6a);
    operator+(&local_50,&local_68,(QString *)path.d.size);
    operator+((QString *)local_38,&local_50,".mustache");
    QString::~QString(&local_50);
    QString::~QString(&local_68);
    QFile::QFile(local_90,(QString *)local_38);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_94,ReadOnly);
    bVar3 = QFile::open((QFlags_conflict *)local_90);
    if ((bVar3 & 1) != 0) {
      QTextStream::QTextStream(local_a8,(QIODevice *)local_90);
      qVar1 = path.d.size;
      QTextStream::readAll();
      local_d0 = (piter)QHash<QString,_QString>::insert(&this->m_cache,(QString *)qVar1,&local_c0);
      QString::~QString(&local_c0);
      QTextStream::~QTextStream(local_a8);
    }
    QFile::~QFile(local_90);
    QString::~QString((QString *)local_38);
  }
  qVar1 = path.d.size;
  QString::QString(&local_e8);
  QHash<QString,_QString>::value(__return_storage_ptr__,&this->m_cache,(QString *)qVar1,&local_e8);
  QString::~QString(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

QString PartialFileLoader::getPartial(const QString& name)
{
	if (!m_cache.contains(name)) {
		QString path = m_basePath + '/' + name + ".mustache";
		QFile file(path);
		if (file.open(QIODevice::ReadOnly)) {
			QTextStream stream(&file);
			m_cache.insert(name, stream.readAll());
		}
	}
	return m_cache.value(name);
}